

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_rotri_i64_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,uint arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  if (arg2 != 0) {
    tcg_gen_rotli_i64_ppc64(tcg_ctx,ret,arg1,0x40 - arg2);
    return;
  }
  if (ret != arg1) {
    pTVar1 = tcg_emit_op_ppc64(tcg_ctx,INDEX_op_mov_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  }
  return;
}

Assistant:

void tcg_gen_rotri_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, unsigned arg2)
{
    tcg_debug_assert(arg2 < 64);
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
        tcg_gen_rotli_i64(tcg_ctx, ret, arg1, 64 - arg2);
    }
}